

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void fejer2_compute(int n,double *x,double *w)

{
  double dVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER2_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  uVar4 = (ulong)(uint)n;
  if (n == 2) {
    *x = -0.5;
    x[1] = 0.5;
    *w = 1.0;
    w[1] = 1.0;
  }
  else {
    if (n != 1) {
      pvVar2 = operator_new__((ulong)(uint)n * 8);
      dVar12 = (double)(int)(n + 1U);
      uVar3 = 0;
      uVar8 = uVar4;
      do {
        *(double *)((long)pvVar2 + uVar3 * 8) = ((double)(int)uVar8 * 3.141592653589793) / dVar12;
        uVar8 = (ulong)((int)uVar8 - 1);
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
      uVar8 = 1;
      if (1 < n) {
        uVar8 = (ulong)(uint)n;
      }
      uVar3 = 0;
      do {
        dVar10 = cos(*(double *)((long)pvVar2 + uVar3 * 8));
        x[uVar3] = dVar10;
        uVar3 = uVar3 + 1;
      } while (uVar8 != uVar3);
      dVar10 = (double)(n + 1U >> 1);
      dVar10 = dVar10 + dVar10 + -1.0;
      uVar8 = 1;
      if (1 < n) {
        uVar8 = uVar4;
      }
      uVar3 = 0;
      do {
        w[uVar3] = 1.0;
        if (2 < (uint)n) {
          iVar6 = 4;
          uVar7 = 2;
          uVar5 = 1;
          do {
            dVar1 = w[uVar3];
            dVar11 = cos((double)uVar7 * *(double *)((long)pvVar2 + uVar3 * 8));
            w[uVar3] = dVar1 - (dVar11 + dVar11) / (double)(int)(iVar6 * uVar5 + -1);
            iVar6 = iVar6 + 4;
            uVar7 = uVar7 + 2;
            bVar9 = uVar5 != n - 1U >> 1;
            uVar5 = uVar5 + 1;
          } while (bVar9);
        }
        dVar1 = w[uVar3];
        dVar11 = cos(*(double *)((long)pvVar2 + uVar3 * 8) * (dVar10 + 1.0));
        w[uVar3] = dVar1 - dVar11 / dVar10;
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar8);
      uVar8 = 1;
      if (1 < n) {
        uVar8 = uVar4;
      }
      uVar4 = 0;
      do {
        w[uVar4] = (w[uVar4] + w[uVar4]) / dVar12;
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
      operator_delete__(pvVar2);
      return;
    }
    *x = 0.0;
    *w = 2.0;
  }
  return;
}

Assistant:

void fejer2_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER2_COMPUTE computes a Fejer type 2 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.
//
//    Thanks to Mike Neish, University of Toronto, for pointing out a
//    memory leak in a previous version of this code, 13 October 2009.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  double p;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER2_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }
  else if ( n == 2 )
  {
    x[0] = -0.5;
    x[1] = +0.5;
    w[0] = 1.0;
    w[1] = 1.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( n + 1 - i ) * r8_pi
               / double( n + 1     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;

    for ( j = 1; j <= ( ( n - 1 ) / 2 ); j++ )
    {
      w[i] = w[i] - 2.0 * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }

    if ( 2 < n )
    {
      p = 2.0 * double( ( n + 1 ) / 2 ) - 1.0;
      w[i] = w[i] - cos ( ( p + 1.0 ) * theta[i] ) / p;
    }

  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n + 1 );
  }

  delete [] theta;

  return;
}